

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall
cfd::core::DescriptorNode::DescriptorNode
          (DescriptorNode *this,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters,NetType network_type)

{
  _Rb_tree_header *p_Var1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  (this->key_info_)._M_dataplus._M_p = (pointer)&(this->key_info_).field_2;
  (this->key_info_)._M_string_length = 0;
  (this->key_info_).field_2._M_local_buf[0] = '\0';
  this->is_uncompressed_key_ = false;
  (this->base_extkey_)._M_dataplus._M_p = (pointer)&(this->base_extkey_).field_2;
  (this->base_extkey_)._M_string_length = 0;
  (this->base_extkey_).field_2._M_local_buf[0] = '\0';
  (this->tweak_sum_)._M_dataplus._M_p = (pointer)&(this->tweak_sum_).field_2;
  (this->tweak_sum_)._M_string_length = 0;
  (this->tweak_sum_).field_2._M_local_buf[0] = '\0';
  this->number_ = 0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_node_).
  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->tree_node_)._M_t._M_impl.super__Rb_tree_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->checksum_)._M_dataplus._M_p = (pointer)&(this->checksum_).field_2;
  (this->checksum_)._M_string_length = 0;
  (this->checksum_).field_2._M_local_buf[0] = '\0';
  this->depth_ = 0;
  this->need_arg_num_ = 0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addr_prefixes_).
  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parent_kind_)._M_dataplus._M_p = (pointer)&(this->parent_kind_).field_2;
  (this->parent_kind_)._M_string_length = 0;
  (this->parent_kind_).field_2._M_local_buf[0] = '\0';
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&this->addr_prefixes_,network_parameters);
  this->network_type_ = network_type;
  return;
}

Assistant:

DescriptorNode::DescriptorNode(
    const std::vector<AddressFormatData>& network_parameters,
    NetType network_type) {
  addr_prefixes_ = network_parameters;
  network_type_ = network_type;
}